

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralSurfaceConnection::~IfcStructuralSurfaceConnection
          (IfcStructuralSurfaceConnection *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)&this->super_IfcStructuralConnection = 0x82ec88;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x140 = 0x82ed00;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x88 = 0x82ecb0;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x98 = 0x82ecd8;
  puVar2 = *(undefined1 **)&(this->super_IfcStructuralConnection).field_0xa8;
  puVar1 = &(this->super_IfcStructuralConnection).field_0xb8;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  *(undefined8 *)&this->super_IfcStructuralConnection = 0x82eda0;
  *(undefined8 *)&(this->super_IfcStructuralConnection).field_0x140 = 0x82edc8;
  puVar2 = *(undefined1 **)&(this->super_IfcStructuralConnection).field_0x60;
  puVar1 = &(this->super_IfcStructuralConnection).field_0x70;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcStructuralConnection).field_0x38;
  puVar1 = &(this->super_IfcStructuralConnection).field_0x48;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  puVar2 = *(undefined1 **)&(this->super_IfcStructuralConnection).field_0x10;
  puVar1 = &(this->super_IfcStructuralConnection).field_0x20;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  operator_delete(this,0x158);
  return;
}

Assistant:

IfcStructuralSurfaceConnection() : Object("IfcStructuralSurfaceConnection") {}